

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_> *
spvtools::opt::anon_unknown_15::GetAllTopLevelConstants
          (vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
           *__return_storage_ptr__,SENode *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ChildContainerType *this;
  reference ppSVar3;
  iterator __first;
  iterator __last;
  __normal_iterator<spvtools::opt::SEConstantNode_**,_std::vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>_>
  local_78;
  const_iterator local_70;
  undefined1 local_68 [8];
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  child_nodes;
  SENode *child;
  iterator __end3;
  iterator __begin3;
  ChildContainerType *__range3;
  SEAddNode *add_node;
  SEConstantNode *recurrent_node;
  SENode *local_18;
  SENode *node_local;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_> *nodes;
  
  recurrent_node._7_1_ = 0;
  local_18 = node;
  node_local = (SENode *)__return_storage_ptr__;
  memset(__return_storage_ptr__,0,0x18);
  std::vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>::
  vector(__return_storage_ptr__);
  iVar2 = (*local_18->_vptr_SENode[4])();
  add_node = (SEAddNode *)CONCAT44(extraout_var,iVar2);
  if (add_node != (SEAddNode *)0x0) {
    std::vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>::
    push_back(__return_storage_ptr__,(value_type *)&add_node);
  }
  iVar2 = (*local_18->_vptr_SENode[8])();
  if ((SENode *)CONCAT44(extraout_var_00,iVar2) != (SENode *)0x0) {
    this = SENode::GetChildren((SENode *)CONCAT44(extraout_var_00,iVar2));
    __end3 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::begin
                       (this);
    child = (SENode *)
            std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::end
                      (this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                                       *)&child), bVar1) {
      ppSVar3 = __gnu_cxx::
                __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                ::operator*(&__end3);
      child_nodes.
      super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppSVar3;
      GetAllTopLevelConstants
                ((vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                  *)local_68,
                 (SENode *)
                 child_nodes.
                 super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_78._M_current =
           (SEConstantNode **)
           std::
           vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
           ::end(__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::SEConstantNode*const*,std::vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>>
      ::__normal_iterator<spvtools::opt::SEConstantNode**>
                ((__normal_iterator<spvtools::opt::SEConstantNode*const*,std::vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>>
                  *)&local_70,&local_78);
      __first = std::
                vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                ::begin((vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                         *)local_68);
      __last = std::
               vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
               ::end((vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                      *)local_68);
      std::vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>::
      insert<__gnu_cxx::__normal_iterator<spvtools::opt::SEConstantNode**,std::vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>>,void>
                ((vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>
                  *)__return_storage_ptr__,local_70,
                 (__normal_iterator<spvtools::opt::SEConstantNode_**,_std::vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>_>
                  )__first._M_current,
                 (__normal_iterator<spvtools::opt::SEConstantNode_**,_std::vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>_>
                  )__last._M_current);
      std::vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
      ::~vector((vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                 *)local_68);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
      ::operator++(&__end3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SEConstantNode*> GetAllTopLevelConstants(SENode* node) {
  auto nodes = std::vector<SEConstantNode*>{};
  if (auto recurrent_node = node->AsSEConstantNode()) {
    nodes.push_back(recurrent_node);
  }

  if (auto add_node = node->AsSEAddNode()) {
    for (auto child : add_node->GetChildren()) {
      auto child_nodes = GetAllTopLevelConstants(child);
      nodes.insert(nodes.end(), child_nodes.begin(), child_nodes.end());
    }
  }

  return nodes;
}